

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O1

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleUInt32::write
          (PLYValueLittleUInt32 *this,int __fd,void *__buf,size_t __n)

{
  undefined1 *puVar1;
  ssize_t sVar2;
  ulong uVar3;
  undefined4 in_register_00000034;
  long *plVar4;
  
  plVar4 = (long *)CONCAT44(in_register_00000034,__fd);
  uVar3 = (ulong)__buf & 0xffffffff;
  if ((undefined1 *)plVar4[5] < (undefined1 *)plVar4[6]) {
    *(undefined1 *)plVar4[5] = (char)uVar3;
    plVar4[5] = plVar4[5] + 1;
  }
  else {
    (**(code **)(*plVar4 + 0x68))(plVar4,(ulong)__buf & 0xff);
  }
  if ((undefined1 *)plVar4[5] < (undefined1 *)plVar4[6]) {
    *(undefined1 *)plVar4[5] = (char)(uVar3 >> 8);
    plVar4[5] = plVar4[5] + 1;
  }
  else {
    (**(code **)(*plVar4 + 0x68))(plVar4,uVar3 >> 8 & 0xff);
  }
  if ((undefined1 *)plVar4[5] < (undefined1 *)plVar4[6]) {
    *(undefined1 *)plVar4[5] = (char)((ulong)__buf >> 0x10);
    plVar4[5] = plVar4[5] + 1;
  }
  else {
    (**(code **)(*plVar4 + 0x68))(plVar4,(ulong)__buf >> 0x10 & 0xff);
  }
  puVar1 = (undefined1 *)plVar4[5];
  if (puVar1 < (undefined1 *)plVar4[6]) {
    *puVar1 = (char)((ulong)__buf >> 0x18);
    plVar4[5] = plVar4[5] + 1;
    return (ssize_t)puVar1;
  }
  sVar2 = (**(code **)(*plVar4 + 0x68))(plVar4,(ulong)__buf >> 0x18 & 0xff);
  return sVar2;
}

Assistant:

void write(std::streambuf *out, unsigned int v)
    {
      out->sputc(static_cast<char>(v&0xff));
      out->sputc(static_cast<char>((v>>8)&0xff));
      out->sputc(static_cast<char>((v>>16)&0xff));
      out->sputc(static_cast<char>((v>>24)&0xff));
    }